

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchIndexedToRGBA32F<(QPixelLayout::BPP)2>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *clut,
          QDitherInfo *param_6)

{
  long lVar1;
  uint uVar2;
  QRgbaFloat32 *pQVar3;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar4;
  uint s;
  int i;
  qsizetype in_stack_ffffffffffffff88;
  int iVar5;
  float local_28;
  float fStack_24;
  float local_20;
  float fStack_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar5 = 0; iVar5 < in_ECX; iVar5 = iVar5 + 1) {
    uVar2 = fetchPixel<(QPixelLayout::BPP)2>(in_RSI,in_EDX + iVar5);
    QList<unsigned_int>::at((QList<unsigned_int> *)CONCAT44(iVar5,uVar2),in_stack_ffffffffffffff88);
    QVar4 = QRgbaFloat<float>::fromArgb32((uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    local_28 = QVar4.r;
    fStack_1c = QVar4.a;
    fStack_24 = QVar4.g;
    local_20 = QVar4.b;
    pQVar3 = in_RDI + iVar5;
    pQVar3->r = local_28 * fStack_1c;
    pQVar3->g = fStack_24 * fStack_1c;
    pQVar3->b = local_20 * fStack_1c;
    pQVar3->a = fStack_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchIndexedToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                         const QList<QRgb> *clut, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = fetchPixel<BPP>(src, index + i);
        buffer[i] = QRgbaFloat32::fromArgb32(clut->at(s)).premultiplied();
    }
    return buffer;
}